

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetBXTransform(ndicapi *pol,int portHandle,float *transform)

{
  float (*pafVar1) [8];
  uint local_2c;
  int n;
  int i;
  float *transform_local;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_2c = 0;
  while (((int)local_2c < (int)(uint)pol->BxHandleCount &&
         (pol->BxHandles[(int)local_2c] != portHandle))) {
    local_2c = local_2c + 1;
  }
  if (local_2c == pol->BxHandleCount) {
    pol_local._4_4_ = 1;
  }
  else {
    pafVar1 = pol->BxTransforms + (int)local_2c;
    *(undefined8 *)transform = *(undefined8 *)*pafVar1;
    *(undefined8 *)(transform + 2) = *(undefined8 *)(*pafVar1 + 2);
    *(undefined8 *)(transform + 4) = *(undefined8 *)(*pafVar1 + 4);
    *(undefined8 *)(transform + 6) = *(undefined8 *)(*pafVar1 + 6);
    if ((pol->BxHandlesStatus[(int)local_2c] & 4U) == 0) {
      if ((pol->BxHandlesStatus[(int)local_2c] & 2U) == 0) {
        pol_local._4_4_ = 0;
      }
      else {
        pol_local._4_4_ = 2;
      }
    }
    else {
      pol_local._4_4_ = 1;
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetBXTransform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->BxTransforms[i][0], sizeof(float) * 8);
  if (pol->BxHandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->BxHandlesStatus[i] & NDI_HANDLE_MISSING)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}